

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionIDTestCase.cpp
# Opt level: O3

void __thiscall SuiteSessionIDTests::TeststreamIn::RunImpl(TeststreamIn *this)

{
  pointer pcVar1;
  TestResults *pTVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  stringstream strstream3;
  stringstream strstream2;
  SessionID object;
  stringstream strstream;
  undefined1 local_668 [32];
  TestDetails local_648;
  undefined1 local_628 [16];
  undefined1 local_618 [376];
  undefined1 local_4a0 [128];
  ios_base aiStack_420 [264];
  SessionID local_318;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  FIX::SessionID::SessionID(&local_318);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"FIX.4.2:SENDER->TARGET",0x16);
  pcVar1 = local_4a0 + 0x10;
  local_4a0._8_8_ = 0;
  local_4a0[0x10] = '\0';
  local_4a0._0_8_ = pcVar1;
  std::operator>>((istream *)local_1b0,(string *)local_4a0);
  FIX::SessionID::fromString(&local_318,(string *)local_4a0);
  if ((pointer)local_4a0._0_8_ != pcVar1) {
    operator_delete((void *)local_4a0._0_8_,CONCAT71(local_4a0._17_7_,local_4a0[0x10]) + 1);
  }
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar3;
  local_4a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4a0,local_318.m_frozenString._M_dataplus._M_p,
             local_318.m_frozenString._M_dataplus._M_p + local_318.m_frozenString._M_string_length);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)local_628,*ppTVar4,0x76);
  UnitTest::CheckEqual<char[23],std::__cxx11::string>
            (pTVar2,(char (*) [23])"FIX.4.2:SENDER->TARGET",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
             (TestDetails *)local_628);
  if ((pointer)local_4a0._0_8_ != pcVar1) {
    operator_delete((void *)local_4a0._0_8_,CONCAT71(local_4a0._17_7_,local_4a0[0x10]) + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_4a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_4a0 + 0x10),"FIX.4.2:SENDER->TARGET:QUALIFIER",0x20);
  local_628._8_8_ = (char *)0x0;
  local_618[0] = '\0';
  local_628._0_8_ = local_618;
  std::operator>>((istream *)local_4a0,(string *)local_628);
  FIX::SessionID::fromString(&local_318,(string *)local_628);
  if ((undefined1 *)local_628._0_8_ != local_618) {
    operator_delete((void *)local_628._0_8_,CONCAT71(local_618._1_7_,local_618[0]) + 1);
  }
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar3;
  local_628._0_8_ = local_618;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_628,local_318.m_frozenString._M_dataplus._M_p,
             local_318.m_frozenString._M_dataplus._M_p + local_318.m_frozenString._M_string_length);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)local_668,*ppTVar4,0x7b);
  UnitTest::CheckEqual<char[33],std::__cxx11::string>
            (pTVar2,(char (*) [33])"FIX.4.2:SENDER->TARGET:QUALIFIER",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628,
             (TestDetails *)local_668);
  if ((undefined1 *)local_628._0_8_ != local_618) {
    operator_delete((void *)local_628._0_8_,CONCAT71(local_618._1_7_,local_618[0]) + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_628);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_618,"FIX.4.2:SENDER-ID->TARGET:QUALIFIER",0x23);
  pcVar1 = local_668 + 0x10;
  local_668._8_8_ = (char *)0x0;
  local_668[0x10] = '\0';
  local_668._0_8_ = pcVar1;
  std::operator>>((istream *)local_628,(string *)local_668);
  FIX::SessionID::fromString(&local_318,(string *)local_668);
  if ((pointer)local_668._0_8_ != pcVar1) {
    operator_delete((void *)local_668._0_8_,CONCAT71(local_668._17_7_,local_668[0x10]) + 1);
  }
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar3;
  local_668._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_668,local_318.m_frozenString._M_dataplus._M_p,
             local_318.m_frozenString._M_dataplus._M_p + local_318.m_frozenString._M_string_length);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_648,*ppTVar4,0x80);
  UnitTest::CheckEqual<char[36],std::__cxx11::string>
            (pTVar2,(char (*) [36])"FIX.4.2:SENDER-ID->TARGET:QUALIFIER",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668,
             &local_648);
  if ((pointer)local_668._0_8_ != pcVar1) {
    operator_delete((void *)local_668._0_8_,CONCAT71(local_668._17_7_,local_668[0x10]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_628);
  std::ios_base::~ios_base((ios_base *)(local_618 + 0x70));
  std::__cxx11::stringstream::~stringstream((stringstream *)local_4a0);
  std::ios_base::~ios_base(aiStack_420);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318.m_frozenString._M_dataplus._M_p != &local_318.m_frozenString.field_2) {
    operator_delete(local_318.m_frozenString._M_dataplus._M_p,
                    local_318.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318.m_sessionQualifier._M_dataplus._M_p != &local_318.m_sessionQualifier.field_2) {
    operator_delete(local_318.m_sessionQualifier._M_dataplus._M_p,
                    local_318.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&local_318.m_targetCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_318.m_senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_318);
  return;
}

Assistant:

TEST(streamIn)
{
  SessionID object;
  std::stringstream strstream;
  strstream << "FIX.4.2:SENDER->TARGET";
  strstream >> object;
  CHECK_EQUAL( "FIX.4.2:SENDER->TARGET", object.toString() );

  std::stringstream strstream2;
  strstream2 << "FIX.4.2:SENDER->TARGET:QUALIFIER";
  strstream2 >> object;
  CHECK_EQUAL( "FIX.4.2:SENDER->TARGET:QUALIFIER", object.toString() );

  std::stringstream strstream3;
  strstream3 << "FIX.4.2:SENDER-ID->TARGET:QUALIFIER";
  strstream3 >> object;
  CHECK_EQUAL( "FIX.4.2:SENDER-ID->TARGET:QUALIFIER", object.toString() );
}